

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::replaceAllUsesWith
          (SubgraphNode<dg::pta::PSNode> *this,PSNode *nd,bool removeDupl)

{
  pointer ppPVar1;
  PSNode *nd_00;
  pointer ppPVar2;
  PSNode *pPVar3;
  pointer ppPVar4;
  ulong uVar5;
  ulong uVar6;
  
  ppPVar1 = (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar4 = (this->users).
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar4 != ppPVar1; ppPVar4 = ppPVar4 + 1) {
    nd_00 = *ppPVar4;
    uVar5 = (ulong)((long)(nd_00->super_SubgraphNode<dg::pta::PSNode>).operands.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(nd_00->super_SubgraphNode<dg::pta::PSNode>).operands.
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      ppPVar2 = (nd_00->super_SubgraphNode<dg::pta::PSNode>).operands.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar3 = ppPVar2[uVar5];
      if (&pPVar3->super_SubgraphNode<dg::pta::PSNode> == this && pPVar3 != (PSNode *)0x0) {
        ppPVar2[uVar5] = nd;
        addUser(&nd->super_SubgraphNode<dg::pta::PSNode>,nd_00);
      }
    }
    if (removeDupl) {
      removeDuplicitOperands(&nd_00->super_SubgraphNode<dg::pta::PSNode>);
    }
  }
  ppPVar4 = (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar4) {
    (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar4;
  }
  return;
}

Assistant:

void replaceAllUsesWith(NodeT *nd, bool removeDupl = true) {
        assert(nd != this && "Replacing uses of 'this' with 'this'");

        // Replace 'this' in every user with 'nd'.
        for (NodeT *user : users) {
            for (int i = 0, e = user->getOperandsNum(); i < e; ++i) {
                if (user->getOperand(i) == this) {
                    user->setOperand(i, nd);
                    // register that 'nd' is now used in 'user'
                    nd->addUser(user);
                }
            }

            if (removeDupl)
                user->removeDuplicitOperands();
        }

        users.clear();
    }